

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

ERROR_HANDLE error_create(char *condition_value)

{
  int iVar1;
  ERROR_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  ERROR_INSTANCE *error_instance;
  
  __ptr = (ERROR_HANDLE)malloc(8);
  if (__ptr != (ERROR_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x1d);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_symbol(condition_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return __ptr;
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (ERROR_HANDLE)0x0;
}

Assistant:

ERROR_HANDLE error_create(const char* condition_value)
{
    ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)malloc(sizeof(ERROR_INSTANCE));
    if (error_instance != NULL)
    {
        error_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(29);
        if (error_instance->composite_value == NULL)
        {
            free(error_instance);
            error_instance = NULL;
        }
        else
        {
            AMQP_VALUE condition_amqp_value;
            int result = 0;

            condition_amqp_value = amqpvalue_create_symbol(condition_value);
            if ((result == 0) && (amqpvalue_set_composite_item(error_instance->composite_value, 0, condition_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(condition_amqp_value);
            if (result != 0)
            {
                error_destroy(error_instance);
                error_instance = NULL;
            }
        }
    }

    return error_instance;
}